

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this,ParamDict *rhs)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  ParamDictPrivate *pPVar4;
  int *piVar5;
  void *__ptr;
  long *plVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  ParamDictPrivate *pPVar11;
  undefined8 *puVar12;
  long lVar13;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_005d1e40;
  pPVar11 = (ParamDictPrivate *)operator_new(0xa00);
  lVar13 = 0x48;
  do {
    *(undefined8 *)((long)&pPVar11->params[0].type + lVar13) = 0;
    puVar1 = (undefined8 *)((long)pPVar11->params + lVar13 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar11->params + lVar13 + -0x34);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar11->params + lVar13 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pPVar11->params + lVar13 + -0x14);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar13 = lVar13 + 0x50;
  } while (lVar13 != 0xa48);
  this->d = pPVar11;
  lVar13 = 0;
  do {
    pPVar11 = rhs->d;
    iVar3 = *(int *)((long)&pPVar11->params[0].type + lVar13);
    pPVar4 = this->d;
    *(int *)((long)&pPVar4->params[0].type + lVar13) = iVar3;
    if (iVar3 - 1U < 3) {
      *(undefined4 *)((long)&pPVar4->params[0].field_1 + lVar13) =
           *(undefined4 *)((long)&pPVar11->params[0].field_1 + lVar13);
    }
    else if (pPVar4 != pPVar11) {
      piVar5 = *(int **)((long)&pPVar11->params[0].v.refcount + lVar13);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = *(int **)((long)&pPVar4->params[0].v.refcount + lVar13);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          __ptr = *(void **)((long)&pPVar4->params[0].v.data + lVar13);
          plVar6 = *(long **)((long)&pPVar4->params[0].v.allocator + lVar13);
          if (plVar6 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar6 + 0x18))();
          }
        }
      }
      puVar12 = (undefined8 *)((long)&pPVar4->params[0].v.data + lVar13);
      *(undefined8 *)((long)&pPVar4->params[0].v.cstep + lVar13) = 0;
      *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar13 + 4) = 0;
      *(undefined8 *)((long)&pPVar4->params[0].v.elemsize + lVar13 + 4) = 0;
      *puVar12 = 0;
      *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar13) = 0;
      *(undefined8 *)((long)&pPVar4->params[0].v.dims + lVar13) = 0;
      *(undefined8 *)((long)&pPVar4->params[0].v.h + lVar13) = 0;
      *(undefined4 *)((long)&pPVar4->params[0].v.c + lVar13) = 0;
      puVar1 = (undefined8 *)((long)&pPVar11->params[0].v.data + lVar13);
      uVar10 = puVar1[1];
      *puVar12 = *puVar1;
      *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar13) = uVar10;
      *(undefined8 *)((long)&pPVar4->params[0].v.elemsize + lVar13) =
           *(undefined8 *)((long)&pPVar11->params[0].v.elemsize + lVar13);
      *(undefined4 *)((long)&pPVar4->params[0].v.elempack + lVar13) =
           *(undefined4 *)((long)&pPVar11->params[0].v.elempack + lVar13);
      *(undefined8 *)((long)&pPVar4->params[0].v.allocator + lVar13) =
           *(undefined8 *)((long)&pPVar11->params[0].v.allocator + lVar13);
      puVar2 = (undefined4 *)((long)&pPVar11->params[0].v.dims + lVar13);
      uVar7 = puVar2[1];
      uVar8 = puVar2[2];
      uVar9 = puVar2[3];
      *(undefined4 *)((long)&pPVar4->params[0].v.dims + lVar13) = *puVar2;
      *(undefined4 *)((long)&pPVar4->params[0].v.w + lVar13) = uVar7;
      *(undefined4 *)((long)&pPVar4->params[0].v.h + lVar13) = uVar8;
      *(undefined4 *)((long)&pPVar4->params[0].v.d + lVar13) = uVar9;
      *(undefined4 *)((long)&pPVar4->params[0].v.c + lVar13) =
           *(undefined4 *)((long)&pPVar11->params[0].v.c + lVar13);
      *(undefined8 *)((long)&pPVar4->params[0].v.cstep + lVar13) =
           *(undefined8 *)((long)&pPVar11->params[0].v.cstep + lVar13);
    }
    lVar13 = lVar13 + 0x50;
  } while (lVar13 != 0xa00);
  return;
}

Assistant:

ParamDict::ParamDict(const ParamDict& rhs)
    : d(new ParamDictPrivate)
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }
}